

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.cpp
# Opt level: O0

double phyr::radicalInverseSpecialized<6833>(uint64_t a)

{
  double *pdVar1;
  ulong in_RDI;
  undefined1 auVar2 [16];
  uint64_t digit;
  uint64_t next;
  double invBaseN;
  uint64_t reversedDigits;
  double invBase;
  double local_38;
  ulong local_30;
  ulong local_28;
  double local_20;
  long local_18;
  undefined8 local_10;
  ulong local_8;
  
  local_10 = 0x3f232ea4ec07f150;
  local_18 = 0;
  local_20 = 1.0;
  local_8 = in_RDI;
  while (local_8 != 0) {
    local_30 = local_8 % 0x1ab1;
    local_18 = local_18 * 0x1ab1 + local_30;
    local_20 = local_20 * 0.00014634860237084735;
    local_28 = local_8 / 0x1ab1;
    local_8 = local_28;
  }
  auVar2._8_4_ = (int)((ulong)local_18 >> 0x20);
  auVar2._0_8_ = local_18;
  auVar2._12_4_ = 0x45300000;
  local_38 = ((auVar2._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_18) - 4503599627370496.0)) * local_20;
  pdVar1 = std::min<double>(&local_38,(double *)&OneMinusEpsilon);
  return *pdVar1;
}

Assistant:

static Real radicalInverseSpecialized(uint64_t a) {
    const Real invBase = (Real)1 / (Real)base;
    uint64_t reversedDigits = 0;
    Real invBaseN = 1;

    while (a) {
        uint64_t next = a / base;
        uint64_t digit = a - next * base;
        reversedDigits = reversedDigits * base + digit;
        invBaseN *= invBase;
        a = next;
    }

    ASSERT(reversedDigits * invBaseN < 1.00001);
    return std::min(reversedDigits * invBaseN, OneMinusEpsilon);
}